

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_util.h
# Opt level: O3

bool google::protobuf::
     InsertIfNotPresent<std::unordered_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
               (unordered_map<std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::equal_to<std::pair<const_google::protobuf::EnumDescriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::EnumDescriptor_*,_int>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                *collection,first_type *key,second_type *value)

{
  __node_base *p_Var1;
  size_type *psVar2;
  EnumDescriptor *pEVar3;
  __node_base_ptr p_Var4;
  __buckets_ptr pp_Var5;
  _Hash_node_base *p_Var6;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var7;
  _Hash_node_base *p_Var8;
  ulong uVar9;
  size_type __n;
  _Hash_node_base _Var10;
  ulong uVar11;
  pointer __ptr_1;
  _Hash_node_base *p_Var12;
  undefined1 auVar13 [16];
  __buckets_alloc_type __alloc;
  new_allocator<std::__detail::_Hash_node_base_*> local_49;
  _Hash_node_base *local_48;
  undefined8 uStack_40;
  
  pEVar3 = key->first;
  local_48 = *(_Hash_node_base **)&key->second;
  p_Var12 = (_Hash_node_base *)((long)(int)local_48 * 0x1000193 ^ (long)pEVar3 * 0x100011b);
  uVar11 = (collection->_M_h)._M_bucket_count;
  uVar9 = (ulong)p_Var12 % uVar11;
  p_Var4 = (collection->_M_h)._M_buckets[uVar9];
  if (p_Var4 != (__node_base_ptr)0x0) {
    p_Var6 = p_Var4->_M_nxt;
    p_Var8 = p_Var6[4]._M_nxt;
    do {
      if (((p_Var8 == p_Var12) && ((EnumDescriptor *)p_Var6[1]._M_nxt == pEVar3)) &&
         (*(int *)&p_Var6[2]._M_nxt == (int)local_48)) {
        return false;
      }
      p_Var6 = p_Var6->_M_nxt;
    } while ((p_Var6 != (_Hash_node_base *)0x0) &&
            (p_Var8 = p_Var6[4]._M_nxt, (ulong)p_Var8 % uVar11 == uVar9));
  }
  uStack_40 = 0;
  p_Var6 = (_Hash_node_base *)operator_new(0x28);
  p_Var6->_M_nxt = (_Hash_node_base *)0x0;
  p_Var6[1]._M_nxt = (_Hash_node_base *)pEVar3;
  p_Var6[2]._M_nxt = local_48;
  p_Var6[3]._M_nxt = (_Hash_node_base *)value;
  local_48 = (_Hash_node_base *)(collection->_M_h)._M_rehash_policy._M_next_resize;
  auVar13 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                      ((ulong)&(collection->_M_h)._M_rehash_policy,
                       (collection->_M_h)._M_bucket_count,(collection->_M_h)._M_element_count);
  __n = auVar13._8_8_;
  if ((auVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    __s = (collection->_M_h)._M_buckets;
  }
  else {
    if (__n == 1) {
      __s = &(collection->_M_h)._M_single_bucket;
      (collection->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    }
    else {
      __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                      (&local_49,__n,(void *)0x0);
      memset(__s,0,__n * 8);
    }
    _Var10._M_nxt = (collection->_M_h)._M_before_begin._M_nxt;
    (collection->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if (_Var10._M_nxt != (_Hash_node_base *)0x0) {
      p_Var1 = &(collection->_M_h)._M_before_begin;
      uVar11 = 0;
      do {
        p_Var8 = (_Var10._M_nxt)->_M_nxt;
        uVar9 = (ulong)_Var10._M_nxt[4]._M_nxt % __n;
        if (__s[uVar9] == (_Hash_node_base *)0x0) {
          (_Var10._M_nxt)->_M_nxt = p_Var1->_M_nxt;
          p_Var1->_M_nxt = _Var10._M_nxt;
          __s[uVar9] = p_Var1;
          if ((_Var10._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
            pp_Var7 = __s + uVar11;
            goto LAB_002b8490;
          }
        }
        else {
          (_Var10._M_nxt)->_M_nxt = __s[uVar9]->_M_nxt;
          pp_Var7 = &__s[uVar9]->_M_nxt;
          uVar9 = uVar11;
LAB_002b8490:
          *pp_Var7 = _Var10._M_nxt;
        }
        _Var10._M_nxt = p_Var8;
        uVar11 = uVar9;
      } while (p_Var8 != (_Hash_node_base *)0x0);
    }
    pp_Var5 = (collection->_M_h)._M_buckets;
    if (&(collection->_M_h)._M_single_bucket != pp_Var5) {
      operator_delete(pp_Var5);
    }
    (collection->_M_h)._M_bucket_count = __n;
    (collection->_M_h)._M_buckets = __s;
    uVar9 = (ulong)p_Var12 % __n;
  }
  p_Var6[4]._M_nxt = p_Var12;
  if (__s[uVar9] == (_Hash_node_base *)0x0) {
    p_Var12 = (collection->_M_h)._M_before_begin._M_nxt;
    p_Var6->_M_nxt = p_Var12;
    (collection->_M_h)._M_before_begin._M_nxt = p_Var6;
    if (p_Var12 != (_Hash_node_base *)0x0) {
      __s[(ulong)p_Var12[4]._M_nxt % (collection->_M_h)._M_bucket_count] = p_Var6;
      __s = (collection->_M_h)._M_buckets;
    }
    __s[uVar9] = &(collection->_M_h)._M_before_begin;
  }
  else {
    p_Var6->_M_nxt = __s[uVar9]->_M_nxt;
    __s[uVar9]->_M_nxt = p_Var6;
  }
  psVar2 = &(collection->_M_h)._M_element_count;
  *psVar2 = *psVar2 + 1;
  return true;
}

Assistant:

bool InsertIfNotPresent(
    Collection* const collection,
    const typename Collection::value_type::first_type& key,
    const typename Collection::value_type::second_type& value) {
  return InsertIfNotPresent(
      collection, typename Collection::value_type(key, value));
}